

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

void __thiscall
hungarian_algorithm::
BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
::doSolve(BruteForceSolver<double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<double>,_unsigned_long>
          *this,size_t row,CombinedCost *accumulated_cost)

{
  ulong *puVar1;
  double dVar2;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar3;
  size_type i;
  const_reference pdVar4;
  ulong uVar5;
  _Bit_type *p_Var6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  CombinedCost new_accumulated_cost;
  CombinedCost local_40;
  
  uVar8 = this->num_rows_;
  if (row < uVar8) {
    uVar5 = this->num_cols_;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      p_Var6 = (this->covered_cols_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar8 = 0;
      do {
        uVar7 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar7 = uVar8;
        }
        lVar9 = (long)uVar7 >> 6;
        uVar7 = (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001);
        uVar10 = 1L << ((byte)uVar8 & 0x3f);
        if ((p_Var6[lVar9 + uVar7 + 0xffffffffffffffff] >> (uVar8 & 0x3f) & 1) == 0) {
          dVar2 = accumulated_cost->second;
          pmVar3 = this->cost_function_;
          i = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                        (row,pmVar3->size1_,uVar8,pmVar3->size2_);
          pdVar4 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::
                   operator[](&pmVar3->data_,i);
          local_40.second = dVar2 + *pdVar4;
          local_40.first = accumulated_cost->first;
          (this->current_assignment_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[row] = uVar8;
          puVar1 = (this->covered_cols_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   lVar9 + uVar7 + 0xffffffffffffffff;
          *puVar1 = *puVar1 | uVar10;
          doSolve(this,row + 1,&local_40);
          p_Var6 = (this->covered_cols_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          p_Var6[lVar9 + uVar7 + 0xffffffffffffffff] =
               p_Var6[lVar9 + uVar7 + 0xffffffffffffffff] & ~uVar10;
          uVar5 = this->num_cols_;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar5);
      uVar8 = this->num_rows_;
    }
    if (uVar5 < uVar8) {
      local_40.first = accumulated_cost->first + 1;
      local_40.second = accumulated_cost->second;
      (this->current_assignment_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[row] = uVar5;
      doSolve(this,row + 1,&local_40);
    }
  }
  else {
    uVar8 = (this->optimal_cost_).first;
    if ((accumulated_cost->first < uVar8) ||
       ((accumulated_cost->first == uVar8 &&
        (dVar2 = (this->optimal_cost_).second,
        accumulated_cost->second <= dVar2 && dVar2 != accumulated_cost->second)))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&this->optimal_assignment_,&this->current_assignment_);
      dVar2 = accumulated_cost->second;
      (this->optimal_cost_).first = accumulated_cost->first;
      (this->optimal_cost_).second = dVar2;
    }
  }
  return;
}

Assistant:

void doSolve(const std::size_t row, const CombinedCost& accumulated_cost)
  {
    if (row < num_rows_)
    {
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        if (!covered_cols_[col])
        {
          const CombinedCost new_accumulated_cost(accumulated_cost.first,
                                                  accumulated_cost.second + cost_function_(Size(row), Size(col)));
          current_assignment_[row] = col;
          covered_cols_[col] = true;
          doSolve(row + 1, new_accumulated_cost);
          covered_cols_[col] = false;
        }
      }

      if (num_cols_ < num_rows_)
      {
        // One possibility is also an invalid assignment:
        const CombinedCost new_accumulated_cost(accumulated_cost.first + 1, accumulated_cost.second);
        current_assignment_[static_cast<std::size_t>(row)] = num_cols_;
        doSolve(row + 1, new_accumulated_cost);
      }
    }
    else if (isBetterThan(accumulated_cost, optimal_cost_))
    {
      optimal_assignment_ = current_assignment_;
      optimal_cost_ = accumulated_cost;
    }
  }